

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void on_request(http_s *request)

{
  int *piVar1;
  ulong uVar2;
  FIOBJ FVar3;
  char cVar4;
  int iVar5;
  fiobj_object_vtable_s *pfVar6;
  size_t sVar7;
  lua_State *L;
  char *pcVar8;
  char *__s;
  FIOBJ FVar9;
  uint uVar10;
  uint uVar11;
  size_t error;
  fio_str_info_s ret;
  char luaPath [256];
  stat path_stat;
  fio_str_info_s local_1d8;
  char local_1b8 [264];
  stat local_b0;
  
  llog_trace("Check path");
  uVar2 = request->path;
  if (uVar2 == 0) {
LAB_0010e435:
    local_1d8.data = anon_var_dwarf_20f;
    local_1d8.len._0_4_ = 4;
    goto LAB_0010e448;
  }
  if ((uVar2 & 1) != 0) {
    fio_ltocstr(&local_1d8,(long)uVar2 >> 1);
    goto LAB_0010e4e2;
  }
  uVar10 = (uint)uVar2 & 6;
  cVar4 = '(';
  switch(uVar10) {
  case 0:
switchD_0010e404_caseD_0:
    cVar4 = *(char *)(uVar2 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0010e404_caseD_4:
    cVar4 = '*';
    break;
  case 6:
    if ((char)uVar2 == '&') {
      local_1d8.data = anon_var_dwarf_21a;
      local_1d8.len._0_4_ = 5;
    }
    else {
      uVar11 = (uint)uVar2 & 0xff;
      if (uVar11 != 0x16) {
        if (uVar11 == 6) goto LAB_0010e435;
        switch(uVar10) {
        case 0:
          goto switchD_0010e404_caseD_0;
        case 4:
          goto switchD_0010e404_caseD_4;
        case 6:
          cVar4 = (char)uVar2;
        }
        break;
      }
      local_1d8.data = anon_var_dwarf_225;
      local_1d8.len._0_4_ = 4;
    }
LAB_0010e448:
    local_1d8.capa._0_4_ = 0;
    local_1d8.capa._4_4_ = 0;
    local_1d8.len._4_4_ = 0;
    goto LAB_0010e4e2;
  }
  switch(cVar4) {
  case '\'':
    pfVar6 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar6 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar6 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar6 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar6 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar6 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar6->to_str)(&local_1d8,uVar2);
LAB_0010e4e2:
  pcVar8 = local_1d8.data;
  sVar7 = strlen(local_1d8.data);
  if (sVar7 < 0x100) {
    memset(local_1b8,0,0x100);
    iVar5 = strcmp(pcVar8,"/");
    if (iVar5 == 0) {
      builtin_strncpy(local_1b8,"pages/index.lua",0x10);
    }
    else {
      snprintf(local_1b8,0x100,"%s%s%s");
    }
    llog_trace(local_1b8);
    llog_trace("Check exists");
    iVar5 = access(local_1b8,0);
    if ((iVar5 != -1) && (stat(local_1b8,&local_b0), (local_b0.st_mode & 0xf000) == 0x8000)) {
      llog_trace("Init Lua");
      L = luaL_newstate();
      luaL_openlibs(L);
      llog_trace("Run file");
      iVar5 = luaL_loadfilex(L,local_1b8,(char *)0x0);
      if (iVar5 == 0) {
        lua_pcallk(L,0,-1,0,0,(lua_KFunction)0x0);
      }
      llog_trace("Run func");
      lua_getglobal(L,"doPage");
      lua_callk(L,0,2,0,(lua_KFunction)0x0);
      llog_trace("Parse returns");
      pcVar8 = lua_tolstring(L,-1,(size_t *)0x0);
      __s = lua_tolstring(L,-2,(size_t *)0x0);
      lua_settop(L,-3);
      llog_trace("Cleanup Lua");
      lua_close(L);
      llog_trace("Return results");
      FVar3 = HTTP_HEADER_CONTENT_TYPE;
      sVar7 = strlen(pcVar8);
      FVar9 = http_mimetype_find(pcVar8,sVar7);
      http_set_header(request,FVar3,FVar9);
      FVar9 = HTTP_HEADER_SERVER_VALUE;
      FVar3 = HTTP_HEADER_SERVER;
      if ((((~(uint)HTTP_HEADER_SERVER_VALUE & 6) != 0) && (HTTP_HEADER_SERVER_VALUE != 0)) &&
         ((HTTP_HEADER_SERVER_VALUE & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((HTTP_HEADER_SERVER_VALUE & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      http_set_header(request,FVar3,FVar9);
      sVar7 = strlen(__s);
      http_send_body(request,__s,sVar7);
      return;
    }
    error = 0x194;
  }
  else {
    error = 500;
  }
  http_send_error(request,error);
  return;
}

Assistant:

void on_request(http_s *request) {
    // Generate the path to the Lua file to handle our request
    llog_trace("Check path");
    // TODO: sanatise path (make sure it doesn't escape the pages folder, etc)
    char* path = fiobj_obj2cstr(request->path).data;
    // The actual max path is MAX_LENGTH-1 (ex. 256-1), since it needs to be null terminated
    // TODO: take into account "pages" and ".lua"
    if(strlen(path) > PATH_MAX_LEN - 1) {
        http_send_error(request, 500);
        return;
    }
    char luaPath[PATH_MAX_LEN];
    memset(luaPath, 0, sizeof(luaPath));
    if (strcmp(path, "/") == 0) {
        // sizeof is useful here because we do want to include the null
        // character in the length
        snprintf(luaPath, sizeof(luaPath), "pages/index.lua");
    } else {
        // Combine "pages", path, and ".lua" to create our target path
        // The path variable should always start with a /
        snprintf(luaPath, sizeof(luaPath), "%s%s%s", "pages", path, ".lua");
    }
    llog_trace(luaPath);

    // Check if the Lua file does not exist
    llog_trace("Check exists");
    if (access(luaPath, F_OK) == -1) {
        http_send_error(request, 404);
        return;
    }

     // Check if it's actually a file, not a folder
    struct stat path_stat;
    stat(luaPath, &path_stat);
    if (!S_ISREG(path_stat.st_mode)) {
        http_send_error(request, 404);
        return;
    }

    // Initialise a Lua interpreter
    llog_trace("Init Lua");
    lua_State* L = luaL_newstate();
    luaL_openlibs(L);

    // Import the file
    llog_trace("Run file");
    luaL_dofile(L, luaPath);

    // Run the doPage() function
    llog_trace("Run func");
    lua_getglobal(L, "doPage");
    lua_call(L, 0, 2);

    // Get the returning strings
    llog_trace("Parse returns");
    char* mime = (char*)lua_tostring(L, -1);
    char* result = (char*)lua_tostring(L, -2);
    lua_pop(L, 2);

    // Close the Lua interpreter session
    llog_trace("Cleanup Lua");
    lua_close(L);

    // Send result to client
    llog_trace("Return results");
    http_set_header(request, HTTP_HEADER_CONTENT_TYPE, http_mimetype_find(mime, strlen(mime)));
    // TODO: not run fiobj_str_new every request for a static header
    http_set_header(
        request, 
        HTTP_HEADER_SERVER, 
        fiobj_dup(HTTP_HEADER_SERVER_VALUE)
    );
    http_send_body(request, result, strlen(result));
}